

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

optional<int> __thiscall slang::strToInt(slang *this,string_view str,size_t *pos,int base)

{
  undefined8 in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *__first;
  __integer_from_chars_result_type<int> _Var3;
  int32_t value;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  __first = (char *)str._M_len;
  _Var3 = std::from_chars<int>(__first,__first + (long)this,(int *)&local_14,(int)pos);
  if (_Var3.ec == 0) {
    if ((long *)str._M_str != (long *)0x0) {
      *(long *)str._M_str = (long)_Var3.ptr - (long)__first;
    }
    uVar1 = (ulong)local_14;
    uVar2 = 0x100000000;
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
  }
  return (optional<int>)(uVar1 | uVar2);
}

Assistant:

std::optional<int32_t> strToInt(std::string_view str, size_t* pos, int base) {
    int32_t value;
    auto result = std::from_chars(str.data(), str.data() + str.size(), value, base);
    if (result.ec != std::errc())
        return std::nullopt;

    if (pos)
        *pos = size_t(result.ptr - str.data());
    return value;
}